

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poppify.cpp
# Opt level: O1

void __thiscall
wasm::anon_unknown_13::PoppifyFunctionsPass::runOnFunction
          (PoppifyFunctionsPass *this,Module *module,Function *func)

{
  iterator __position;
  undefined1 auVar1 [16];
  bool bVar2;
  size_t sVar3;
  mapped_type *this_00;
  Type *pTVar4;
  Type *pTVar5;
  Type in_R8;
  undefined1 local_100 [48];
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_d0;
  _Hashtable<wasm::Type,_std::pair<const_wasm::Type,_unsigned_int>,_std::allocator<std::pair<const_wasm::Type,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_98;
  Type local_60;
  Type localType;
  Index local_4c;
  undefined1 local_48 [8];
  Iterator __begin4;
  Index i;
  
  if (func->profile != Poppy) {
    local_100._24_8_ = (pointer)0x0;
    local_100._32_8_ = (pointer)0x0;
    local_100._40_8_ = (pointer)0x0;
    local_d0._M_buckets = (__buckets_ptr)(local_100 + 0x60);
    local_d0._M_bucket_count = 1;
    local_d0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_d0._M_element_count = 0;
    local_d0._M_rehash_policy._M_max_load_factor = 1.0;
    local_d0._M_rehash_policy._M_next_resize = 0;
    local_d0._M_single_bucket = (__node_base_ptr)0x0;
    local_98._M_buckets = (__buckets_ptr)(local_100 + 0x98);
    local_98._M_bucket_count = 1;
    local_98._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_98._M_element_count = 0;
    local_98._M_rehash_policy._M_max_load_factor = 1.0;
    local_98._M_rehash_policy._M_next_resize = 0;
    local_98._M_single_bucket = (__node_base_ptr)0x0;
    local_48 = (undefined1  [8])((ulong)local_48 & 0xffffffff00000000);
    local_100._0_8_ = func;
    local_100._8_8_ = module;
    local_100._16_8_ = module;
    std::
    vector<wasm::(anonymous_namespace)::Poppifier::Scope,_std::allocator<wasm::(anonymous_namespace)::Poppifier::Scope>_>
    ::emplace_back<wasm::(anonymous_namespace)::Poppifier::Scope::Kind>
              ((vector<wasm::(anonymous_namespace)::Poppifier::Scope,_std::allocator<wasm::(anonymous_namespace)::Poppifier::Scope>_>
                *)(local_100 + 0x18),(Kind *)local_48);
    sVar3 = Function::getNumParams(func);
    __begin4.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index._4_4_ =
         (uint)sVar3;
    localType.id = Function::getNumLocals(func);
    if (__begin4.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index._4_4_ <
        (uint)localType.id) {
      do {
        local_60 = Function::getLocalType
                             (func,__begin4.
                                   super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                   .index._4_4_);
        bVar2 = wasm::Type::isTuple(&local_60);
        if (bVar2) {
          this_00 = std::__detail::
                    _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)(local_100 + 0x30),
                                 (key_type *)
                                 ((long)&__begin4.
                                         super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                         .index + 4));
          __begin4.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
               (Type *)0x0;
          local_48 = (undefined1  [8])&local_60;
          pTVar4 = (Type *)wasm::Type::size(&local_60);
          if (__begin4.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent ==
              pTVar4) goto LAB_0081e051;
          do {
            do {
              pTVar5 = wasm::Type::Iterator::operator*((Iterator *)local_48);
              auVar1._8_8_ = 0;
              auVar1._0_8_ = pTVar5->id;
              local_4c = Builder::addVar((Builder *)func,(Function *)0x0,(Name)(auVar1 << 0x40),
                                         in_R8);
              __position._M_current =
                   (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
              if (__position._M_current ==
                  (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                  .super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                _M_realloc_insert<unsigned_int>(this_00,__position,&local_4c);
              }
              else {
                *__position._M_current = local_4c;
                (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish = __position._M_current + 1;
              }
              __begin4.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
                   (Type *)((long)&(__begin4.
                                    super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                   .parent)->id + 1);
            } while (__begin4.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                     parent != pTVar4);
LAB_0081e051:
          } while (local_48 != (undefined1  [8])&local_60);
        }
        __begin4.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index._4_4_ =
             __begin4.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index.
             _4_4_ + 1;
      } while (__begin4.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index.
               _4_4_ < (uint)localType.id);
    }
    if ((Function *)local_100._0_8_ == (Function *)0x0) {
      __assert_fail("func && \"BinaryenIRWriter: function is not set\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-stack.h"
                    ,0xc5,
                    "void wasm::BinaryenIRWriter<wasm::(anonymous namespace)::Poppifier>::write() [SubType = wasm::(anonymous namespace)::Poppifier]"
                   );
    }
    BinaryenIRWriter<wasm::(anonymous_namespace)::Poppifier>::visitPossibleBlockContents
              ((BinaryenIRWriter<wasm::(anonymous_namespace)::Poppifier> *)local_100,
               *(Expression **)(local_100._0_8_ + 0x60));
    if (((pointer)(local_100._32_8_ + -0x20))->kind != Func) {
      __assert_fail("scope.kind == Scope::Func",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Poppify.cpp"
                    ,0x136,"void wasm::(anonymous namespace)::Poppifier::emitFunctionEnd()");
    }
    Poppifier::patchScope((Poppifier *)local_100,(Expression **)(local_100._0_8_ + 0x60));
    std::
    _Hashtable<wasm::Type,_std::pair<const_wasm::Type,_unsigned_int>,_std::allocator<std::pair<const_wasm::Type,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<wasm::Type,_std::pair<const_wasm::Type,_unsigned_int>,_std::allocator<std::pair<const_wasm::Type,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)(local_100 + 0x68));
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)(local_100 + 0x30));
    std::
    vector<wasm::(anonymous_namespace)::Poppifier::Scope,_std::allocator<wasm::(anonymous_namespace)::Poppifier::Scope>_>
    ::~vector((vector<wasm::(anonymous_namespace)::Poppifier::Scope,_std::allocator<wasm::(anonymous_namespace)::Poppifier::Scope>_>
               *)(local_100 + 0x18));
    func->profile = Poppy;
  }
  return;
}

Assistant:

void runOnFunction(Module* module, Function* func) override {
    if (func->profile != IRProfile::Poppy) {
      Poppifier(func, module).write();
      func->profile = IRProfile::Poppy;
    }
  }